

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source-map.cpp
# Opt level: O1

optional<wasm::Function::DebugLocation> * __thiscall
wasm::SourceMapReader::readDebugLocationAt
          (optional<wasm::Function::DebugLocation> *__return_storage_ptr__,SourceMapReader *this,
          size_t currLocation)

{
  uint32_t uVar1;
  char cVar2;
  bool bVar3;
  int32_t iVar4;
  size_t sVar5;
  string *psVar6;
  ulong uVar7;
  undefined1 *local_68;
  long local_60;
  undefined1 local_58 [16];
  undefined1 *local_48;
  long local_40;
  undefined1 local_38 [16];
  
  sVar5 = this->location;
  do {
    if (currLocation <= sVar5 - 1) {
LAB_00c66588:
      if (this->hasInfo == true) {
        bVar3 = this->hasSymbol;
        uVar7 = (ulong)this->symbol;
        uVar1 = this->col;
        if ((ulong)bVar3 == 0) {
          uVar7 = 0;
        }
        *(undefined8 *)
         &(__return_storage_ptr__->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
          _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload =
             *(undefined8 *)&this->file;
        (__return_storage_ptr__->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
        _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload._M_value.
        columnNumber = uVar1;
        (__return_storage_ptr__->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
        _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload._M_value.
        symbolNameIndex.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int> =
             (_Optional_payload_base<unsigned_int>)(uVar7 | (ulong)bVar3 << 0x20);
        bVar3 = true;
      }
      else {
        bVar3 = false;
      }
      (__return_storage_ptr__->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
      _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged = bVar3;
      return __return_storage_ptr__;
    }
    cVar2 = peek(this);
    if ((cVar2 == ',') || (cVar2 == '\"')) {
      this->hasInfo = false;
    }
    else {
      this->hasInfo = true;
      iVar4 = readBase64VLQ(this);
      this->file = this->file + iVar4;
      iVar4 = readBase64VLQ(this);
      this->line = this->line + iVar4;
      iVar4 = readBase64VLQ(this);
      this->col = this->col + iVar4;
      cVar2 = peek(this);
      if ((cVar2 == '\"') || (cVar2 == ',')) {
        this->hasSymbol = false;
      }
      else {
        if (cVar2 == ';') {
          psVar6 = (string *)__cxa_allocate_exception(0x20);
          local_68 = local_58;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_68,"Unexpected mapping for 2nd generated line","");
          *(string **)psVar6 = psVar6 + 0x10;
          std::__cxx11::string::_M_construct<char*>(psVar6,local_68,local_68 + local_60);
          __cxa_throw(psVar6,&MapParseException::typeinfo,MapParseException::~MapParseException);
        }
        this->hasSymbol = true;
        iVar4 = readBase64VLQ(this);
        this->symbol = this->symbol + iVar4;
      }
    }
    cVar2 = peek(this);
    if (cVar2 == '\"') {
      this->location = 0;
      goto LAB_00c66588;
    }
    cVar2 = peek(this);
    this->pos = this->pos + 1;
    if (cVar2 != ',') {
      psVar6 = (string *)__cxa_allocate_exception(0x20);
      local_48 = local_38;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Expected delimiter","");
      *(string **)psVar6 = psVar6 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar6,local_48,local_48 + local_40);
      __cxa_throw(psVar6,&MapParseException::typeinfo,MapParseException::~MapParseException);
    }
    iVar4 = readBase64VLQ(this);
    sVar5 = this->location;
    this->location = sVar5 + (long)iVar4;
    sVar5 = (long)iVar4 + sVar5;
  } while( true );
}

Assistant:

std::optional<Function::DebugLocation>
SourceMapReader::readDebugLocationAt(size_t currLocation) {
  while (location && location <= currLocation) {
    do {
      char next = peek();
      if (next == ',' || next == '\"') {
        // This is a 1-length entry, so the next location has no debug info.
        hasInfo = false;
        break;
      }

      hasInfo = true;
      file += readBase64VLQ();
      line += readBase64VLQ();
      col += readBase64VLQ();

      next = peek();
      if (next == ';') {
        // Generated JS files can have multiple lines, and mappings for each
        // line are separated by ';'. Wasm files do not have lines, so there
        // should be only one generated "line".
        throw MapParseException("Unexpected mapping for 2nd generated line");
      }
      if (next == ',' || next == '\"') {
        hasSymbol = false;
        break;
      }

      hasSymbol = true;
      symbol += readBase64VLQ();

    } while (false);

    // Check whether there is another record to read the position for.

    if (peek() == '\"') {
      // End of records.
      location = 0;
      break;
    }
    if (get() != ',') {
      throw MapParseException("Expected delimiter");
    }

    // Set up for the next record.
    location += readBase64VLQ();
  }

  if (!hasInfo) {
    return std::nullopt;
  }
  auto sym = hasSymbol ? symbol : std::optional<uint32_t>{};
  return Function::DebugLocation{file, line, col, sym};
}